

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_24_3_1824b316 comp)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int *piVar15;
  long lVar16;
  bool local_81;
  
  if (begin._M_current == end._M_current) {
    local_81 = true;
  }
  else {
    lVar16 = 0;
    uVar8 = 0;
    _Var9._M_current = begin._M_current;
    do {
      piVar10 = _Var9._M_current + 1;
      local_81 = piVar10 == end._M_current;
      if (local_81) {
        return local_81;
      }
      iVar3 = _Var9._M_current[1];
      iVar4 = *_Var9._M_current;
      pdVar5 = ((comp.this)->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar1 = pdVar5[iVar3];
      dVar2 = (comp.this)->feastol;
      if ((dVar1 <= dVar2) || (dVar2 < pdVar5[iVar4])) {
        if ((dVar2 < dVar1) || (pdVar5[iVar4] <= dVar2)) {
          puVar6 = ((comp.this)->complementation).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar13 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar4] != '\0']._M_t
                                   .
                                   super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                   .
                                   super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             + 0x30 + (long)(comp.this)->inds[iVar4] * 0x38);
          lVar14 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0']._M_t
                                   .
                                   super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                   .
                                   super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             + 0x30 + (long)(comp.this)->inds[iVar3] * 0x38);
          if ((lVar13 < lVar14) ||
             ((lVar13 <= lVar14 &&
              (uVar12 = (ulong)(uint)(comp.this)->inds[iVar3],
              lVar13 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
              lVar14 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
              uVar7 = (ulong)(uint)(comp.this)->inds[iVar4],
              ((uVar7 + 0xc8497d2a400d9551) * lVar14 >> 0x20 ^ (uVar7 + 0x42d8680e260ae5b) * lVar13)
              < ((uVar12 + 0xc8497d2a400d9551) * lVar14 >> 0x20 ^
                (uVar12 + 0x42d8680e260ae5b) * lVar13))))) goto LAB_00289d5b;
        }
      }
      else {
LAB_00289d5b:
        _Var9._M_current[1] = *_Var9._M_current;
        piVar15 = _Var9._M_current;
        if (_Var9._M_current != begin._M_current) {
          lVar13 = 0;
          do {
            iVar4 = *(_Var9._M_current + lVar13 + -4);
            if ((dVar1 <= dVar2) || (dVar2 < pdVar5[iVar4])) {
              if ((dVar1 <= dVar2) && (dVar2 < pdVar5[iVar4])) break;
              puVar6 = ((comp.this)->complementation).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar14 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar4] != '\0'].
                                       _M_t.
                                       super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                       .
                                       super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                                 + 0x30 + (long)(comp.this)->inds[iVar4] * 0x38);
              lVar11 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0'].
                                       _M_t.
                                       super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                       .
                                       super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                                 + 0x30 + (long)(comp.this)->inds[iVar3] * 0x38);
              if ((lVar11 <= lVar14) &&
                 ((lVar11 < lVar14 ||
                  (uVar12 = (ulong)(uint)(comp.this)->inds[iVar3],
                  lVar14 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
                  lVar11 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
                  uVar7 = (ulong)(uint)(comp.this)->inds[iVar4],
                  ((uVar12 + 0xc8497d2a400d9551) * lVar11 >> 0x20 ^
                  (uVar12 + 0x42d8680e260ae5b) * lVar14) <=
                  ((uVar7 + 0xc8497d2a400d9551) * lVar11 >> 0x20 ^
                  (uVar7 + 0x42d8680e260ae5b) * lVar14))))) goto LAB_00289f4a;
            }
            piVar15 = piVar15 + -1;
            *(undefined4 *)((long)_Var9._M_current + lVar13) =
                 *(undefined4 *)((long)_Var9._M_current + lVar13 + -4);
            lVar13 = lVar13 + -4;
          } while (lVar16 != lVar13);
          piVar15 = _Var9._M_current + lVar13;
        }
LAB_00289f4a:
        *piVar15 = iVar3;
        uVar8 = uVar8 + ((long)piVar10 - (long)piVar15 >> 2);
      }
      lVar16 = lVar16 + -4;
      _Var9._M_current = piVar10;
    } while (uVar8 < 9);
  }
  return local_81;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }